

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O1

DWORD * __thiscall
MIDISong2::SendCommand
          (MIDISong2 *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  byte *pbVar1;
  BYTE BVar2;
  char cVar3;
  ulong uVar4;
  BYTE *pBVar5;
  TrackInfo *pTVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  undefined1 uVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  DWORD *__dest;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  
  *sysex_noroom = false;
  uVar21 = track->TrackP;
  uVar4 = track->MaxTrackP;
  if (uVar4 <= uVar21) goto LAB_0036161d;
  pBVar5 = track->TrackBegin;
  uVar17 = uVar21 + 1;
  track->TrackP = uVar17;
  if (uVar4 <= uVar17) goto LAB_0036161d;
  bVar19 = pBVar5[uVar21];
  uVar22 = (uint)bVar19;
  *events = delay;
  events[1] = 0;
  events[2] = 0x2000000;
  if ((bVar19 - 0xf0 < 0x10) && ((0x8081U >> (bVar19 - 0xf0 & 0x1f) & 1) != 0)) {
    if (bVar19 != 0xf0) {
      if (bVar19 == 0xff) {
        uVar17 = uVar21 + 2;
        track->TrackP = uVar17;
        if (uVar17 < uVar4) {
          BVar2 = pBVar5[uVar21 + 1];
          pBVar5 = track->TrackBegin;
          uVar22 = 0;
          do {
            if (uVar4 <= uVar17) break;
            track->TrackP = uVar17 + 1;
            pbVar1 = pBVar5 + uVar17;
            uVar22 = uVar22 << 7 | *pbVar1 & 0x7f;
            uVar17 = uVar17 + 1;
          } while ((char)*pbVar1 < '\0');
          uVar21 = track->TrackP;
          if (uVar21 < uVar4) {
            uVar17 = uVar22 + uVar21;
            if (uVar17 <= uVar4) {
              if (BVar2 == 'Q') {
                (this->super_MIDIStreamer).Tempo =
                     (uint)pBVar5[uVar21 + 2] |
                     (uint)pBVar5[uVar21 + 1] << 8 | (uint)pBVar5[uVar21] << 0x10;
                *events = delay;
                events[1] = 0;
                events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
              }
              else if (BVar2 == '/') {
                track->Finished = true;
              }
              track->TrackP = uVar17;
              if (uVar17 != uVar4) goto LAB_003616e9;
            }
            track->Finished = true;
            goto LAB_003616e9;
          }
        }
        goto LAB_0036161d;
      }
      if (uVar22 != 0xf7) goto LAB_003616e9;
    }
    uVar22 = 0;
    do {
      if (uVar4 <= uVar17) break;
      track->TrackP = uVar17 + 1;
      pbVar1 = track->TrackBegin + uVar17;
      uVar22 = uVar22 << 7 | *pbVar1 & 0x7f;
      uVar17 = uVar17 + 1;
    } while ((char)*pbVar1 < '\0');
    if (uVar22 < 0x5f4) {
      if ((ulong)(room * 4) <= (ulong)(uVar22 + 0xc)) {
        track->TrackP = uVar21;
        *sysex_noroom = true;
        return events;
      }
      if (bVar19 == 0xf0) {
        events[2] = uVar22 + 0x80000001;
        __dest = (DWORD *)((long)events + 0xd);
        *(undefined1 *)(events + 3) = 0xf0;
      }
      else {
        __dest = events + 3;
        events[2] = uVar22 | 0x80000000;
      }
      uVar21 = (ulong)uVar22;
      memcpy(__dest,track->TrackBegin + track->TrackP,uVar21);
      if (((long)__dest + uVar21 & 3) != 0) {
        memset((void *)((long)__dest + uVar21),0,(ulong)(~uVar22 - (int)__dest & 3) + 1);
      }
      track->TrackP = track->TrackP + uVar21;
    }
    else {
      track->TrackP = track->TrackP + (ulong)uVar22;
    }
    goto LAB_003616e9;
  }
  uVar18 = (uint)bVar19;
  uVar20 = uVar18;
  if ((~uVar22 & 0xf0) == 0) {
    if (MIDI_CommonLengths[uVar22 & 0xf] < '\x01') {
      uVar22 = 0;
      uVar18 = 0;
    }
    else {
      track->TrackP = uVar21 + 2;
      uVar18 = (uint)pBVar5[uVar21 + 1];
      if (MIDI_CommonLengths[uVar22 & 0xf] < '\x02') goto LAB_00361587;
      track->TrackP = uVar21 + 3;
      uVar22 = (uint)pBVar5[uVar21 + 2];
    }
  }
  else if ((char)bVar19 < '\0') {
    track->RunningStatus = bVar19;
    track->TrackP = uVar21 + 2;
    uVar18 = (uint)pBVar5[uVar21 + 1];
LAB_00361587:
    uVar22 = 0;
  }
  else {
    uVar22 = 0;
    uVar20 = (uint)track->RunningStatus;
  }
  bVar19 = (byte)uVar20;
  uVar21 = track->TrackP;
  if (uVar4 <= uVar21) {
LAB_0036161d:
    track->Finished = true;
    return events;
  }
  uVar7 = uVar20 & 0x70;
  if (MIDI_EventLengths[uVar7 >> 4] == '\x02') {
    track->TrackP = uVar21 + 1;
    uVar22 = (uint)pBVar5[uVar21];
  }
  uVar11 = uVar22;
  if (uVar7 == 0x30) {
    bVar14 = (byte)uVar22;
    switch(uVar18) {
    case 0x6e:
      if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
        if (bVar14 == 0x7f) {
          track->Designation = 0xffff;
          track->Designated = true;
LAB_00361696:
          bVar19 = 0xff;
        }
        else {
          bVar19 = 0xff;
          if (bVar14 < 10) {
            track->Designation = track->Designation | (ushort)(1 << (bVar14 & 0x1f));
            track->Designated = true;
          }
        }
      }
      break;
    case 0x6f:
      if (((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) &&
          (bVar19 = 0xff, track->Designated == true)) && (bVar14 < 10)) {
        track->Designation =
             track->Designation &
             ((ushort)(-2 << (bVar14 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar14 & 0x1f)));
      }
      break;
    case 0x70:
      if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
         (track->EProgramChange == true)) {
        track->EProgramChange = true;
        bVar19 = bVar19 & 0xf | 0xc0;
        uVar11 = 0;
        uVar18 = uVar22;
      }
      break;
    case 0x71:
      if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
         (track->EVolume == true)) {
        track->EVolume = true;
        uVar11 = MIDIStreamer::VolumeControllerChange(&this->super_MIDIStreamer,uVar20 & 0xf,uVar22)
        ;
        uVar18 = 7;
      }
      break;
    case 0x72:
    case 0x73:
      break;
    case 0x74:
      iVar8 = uVar22 + 1;
      if (bVar14 == 0) {
        iVar8 = 0;
      }
      iVar8 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar8);
      bVar19 = 0xff;
      if (iVar8 != 1) {
        track->LoopBegin = track->TrackP;
        iVar10 = iVar8 + -1;
        if (iVar8 == 0) {
          iVar10 = 0;
        }
        track->LoopDelay = 0;
        track->LoopCount = iVar10;
        track->LoopFinished = track->Finished;
      }
      break;
    case 0x75:
      iVar8 = track->LoopCount;
      bVar19 = 0xff;
      if ((-1 < iVar8) && (bVar14 == 0x7f)) {
        if ((iVar8 == 0) && ((this->super_MIDIStreamer).super_MusInfo.m_Looping == false)) {
          track->Finished = true;
        }
        else {
          if (0 < iVar8) {
            track->LoopCount = -(uint)(iVar8 - 1U == 0) | iVar8 - 1U;
          }
          track->TrackP = track->LoopBegin;
          track->Delay = track->LoopDelay;
          track->Finished = track->LoopFinished;
        }
      }
      break;
    case 0x76:
      iVar8 = 0;
      if (bVar14 != 0) {
        iVar8 = uVar22 + 1;
      }
      iVar8 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar8);
      bVar19 = 0xff;
      if ((iVar8 != 1) && (iVar10 = this->NumTracks, 0 < (long)iVar10)) {
        pTVar6 = this->Tracks;
        lVar12 = 0;
        iVar9 = iVar8 + -1;
        if (iVar8 == 0) {
          iVar9 = 0;
        }
        do {
          *(undefined8 *)((long)&pTVar6->LoopBegin + lVar12) =
               *(undefined8 *)((long)&pTVar6->TrackP + lVar12);
          *(undefined4 *)((long)&pTVar6->LoopDelay + lVar12) =
               *(undefined4 *)((long)&pTVar6->Delay + lVar12);
          *(int *)((long)&pTVar6->LoopCount + lVar12) = iVar9;
          (&pTVar6->LoopFinished)[lVar12] = (&pTVar6->Finished)[lVar12];
          lVar12 = lVar12 + 0x40;
        } while ((long)iVar10 * 0x40 != lVar12);
      }
      break;
    case 0x77:
      bVar19 = 0xff;
      if ((bVar14 == 0x7f) && (0 < this->NumTracks)) {
        lVar12 = 0x38;
        lVar13 = 0;
        do {
          pTVar6 = this->Tracks;
          iVar8 = *(int *)((long)pTVar6 + lVar12 + -4);
          if (-1 < iVar8) {
            if ((iVar8 != 0) ||
               (uVar15 = 1, (this->super_MIDIStreamer).super_MusInfo.m_Looping == true)) {
              iVar8 = *(int *)((long)pTVar6 + lVar12 + -4);
              if (0 < iVar8) {
                uVar22 = iVar8 - 1;
                *(uint *)((long)pTVar6 + lVar12 + -4) = -(uint)(uVar22 == 0) | uVar22;
              }
              *(undefined8 *)((long)pTVar6 + lVar12 + -0x30) =
                   *(undefined8 *)((long)pTVar6 + lVar12 + -0x10);
              *(undefined4 *)((long)pTVar6 + lVar12 + -0x20) =
                   *(undefined4 *)((long)pTVar6 + lVar12 + -8);
              uVar15 = *(undefined1 *)((long)&pTVar6->TrackBegin + lVar12);
            }
            *(undefined1 *)((long)pTVar6 + lVar12 + -0x18) = uVar15;
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0x40;
        } while (lVar13 < this->NumTracks);
      }
      break;
    default:
      if (uVar18 == 0x27) {
        cVar3 = track->EVolume;
        goto LAB_003615d0;
      }
      if (uVar18 == 7) {
        if (track->EVolume != false) goto LAB_00361696;
        uVar11 = MIDIStreamer::VolumeControllerChange(&this->super_MIDIStreamer,uVar20 & 0xf,uVar22)
        ;
      }
    }
  }
  else if (uVar7 == 0x40) {
    cVar3 = track->EProgramChange;
LAB_003615d0:
    if (cVar3 != '\0') {
      bVar19 = 0xff;
    }
  }
  if ((bVar19 != 0xff) &&
     ((track->Designated != true || ((track->Designation & this->DesignationMask) != 0)))) {
    events[2] = (uVar11 & 0xff) << 0x10 | uVar18 << 8 | (uint)bVar19;
  }
LAB_003616e9:
  if (track->Finished == false) {
    uVar22 = 0;
    sVar16 = track->TrackP;
    do {
      if (track->MaxTrackP <= sVar16) break;
      track->TrackP = sVar16 + 1;
      pbVar1 = track->TrackBegin + sVar16;
      uVar22 = uVar22 << 7 | *pbVar1 & 0x7f;
      sVar16 = sVar16 + 1;
    } while ((char)*pbVar1 < '\0');
    track->Delay = uVar22;
  }
  if ((*events == 0) && (*(char *)((long)events + 0xb) == '\x02')) {
    return events;
  }
  return events + 3;
}

Assistant:

DWORD *MIDISong2::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;
	int i;

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		switch (event & 0x70)
		{
		case MIDI_PRGMCHANGE & 0x70:
			if (track->EProgramChange)
			{
				event = MIDI_META;
			}
			break;

		case MIDI_CTRLCHANGE & 0x70:
			switch (data1)
			{
			case 7:		// Channel volume
				if (track->EVolume)
				{ // Tracks that use EMIDI volume ignore normal volume changes.
					event = MIDI_META;
				}
				else
				{
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 7+32:	// Channel volume (LSB)
				if (track->EVolume)
				{
					event = MIDI_META;
				}
				// It should be safe to pass this straight through to the
				// MIDI device, since it's a very fine amount.
				break;

			case 110:	// EMIDI Track Designation - InitBeat only
				// Instruments 4, 5, 6, and 7 are all FM synth.
				// The rest are all wavetable.
				if (track->PlayedTime < (DWORD)Division)
				{
					if (data2 == 127)
					{
						track->Designation = ~0;
						track->Designated = true;
					}
					else if (data2 <= 9)
					{
						track->Designation |= 1 << data2;
						track->Designated = true;
					}
					event = MIDI_META;
				}
				break;

			case 111:	// EMIDI Track Exclusion - InitBeat only
				if (track->PlayedTime < (DWORD)Division)
				{
					if (track->Designated && data2 <= 9)
					{
						track->Designation &= ~(1 << data2);
					}
					event = MIDI_META;
				}
				break;

			case 112:	// EMIDI Program Change
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EProgramChange)
				{
					track->EProgramChange = true;
					event = 0xC0 | (event & 0x0F);
					data1 = data2;
					data2 = 0;
				}
				break;

			case 113:	// EMIDI Volume
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EVolume)
				{
					track->EVolume = true;
					data1 = 7;
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 116:	// EMIDI Loop Begin
				{
					// We convert the loop count to XMIDI conventions before clamping.
					// Then we convert it back to EMIDI conventions after clamping.
					// (XMIDI can create "loops" that don't loop. EMIDI cannot.)
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						track->LoopBegin = track->TrackP;
						track->LoopDelay = 0;
						track->LoopCount = loopcount == 0 ? 0 : loopcount - 1;
						track->LoopFinished = track->Finished;
					}
				}
				event = MIDI_META;
				break;

			case 117:	// EMIDI Loop End
				if (track->LoopCount >= 0 && data2 == 127)
				{
					if (track->LoopCount == 0 && !m_Looping)
					{
						track->Finished = true;
					}
					else
					{
						if (track->LoopCount > 0 && --track->LoopCount == 0)
						{
							track->LoopCount = -1;
						}
						track->TrackP = track->LoopBegin;
						track->Delay = track->LoopDelay;
						track->Finished = track->LoopFinished;
					}
				}
				event = MIDI_META;
				break;

			case 118:	// EMIDI Global Loop Begin
				{
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						for (i = 0; i < NumTracks; ++i)
						{
							Tracks[i].LoopBegin = Tracks[i].TrackP;
							Tracks[i].LoopDelay = Tracks[i].Delay;
							Tracks[i].LoopCount = loopcount == 0 ? 0 : loopcount - 1;
							Tracks[i].LoopFinished = Tracks[i].Finished;
						}
					}
				}
				event = MIDI_META;
				break;

			case 119:	// EMIDI Global Loop End
				if (data2 == 127)
				{
					for (i = 0; i < NumTracks; ++i)
					{
						if (Tracks[i].LoopCount >= 0)
						{
							if (Tracks[i].LoopCount == 0 && !m_Looping)
							{
								Tracks[i].Finished = true;
							}
							else
							{
								if (Tracks[i].LoopCount > 0 && --Tracks[i].LoopCount == 0)
								{
									Tracks[i].LoopCount = -1;
								}
								Tracks[i].TrackP = Tracks[i].LoopBegin;
								Tracks[i].Delay = Tracks[i].LoopDelay;
								Tracks[i].Finished = Tracks[i].LoopFinished;
							}
						}
					}
				}
				event = MIDI_META;
				break;
			}
		}
		if (event != MIDI_META && (!track->Designated || (track->Designation & DesignationMask)))
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = track->ReadVarLen();
			if (len >= (MAX_EVENTS-1)*3*4)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = track->ReadVarLen ();
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
	}